

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

CapabilityPipe * __thiscall
kj::anon_unknown_30::AsyncIoProviderImpl::newCapabilityPipe
          (CapabilityPipe *__return_storage_ptr__,AsyncIoProviderImpl *this)

{
  int iVar1;
  int fds [2];
  Fault f;
  
  do {
    iVar1 = socketpair(1,0x80801,0,fds);
    if (-1 < iVar1) goto LAB_002effad;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x600,iVar1,"socketpair(AF_UNIX, type, 0, fds)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_002effad:
  (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[3])
            (__return_storage_ptr__,this->lowLevel,(ulong)(uint)fds[0],7);
  (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[3])
            (__return_storage_ptr__->ends + 1,this->lowLevel,(ulong)(uint)fds[1],7);
  return __return_storage_ptr__;
}

Assistant:

CapabilityPipe newCapabilityPipe() override {
    int fds[2];
    int type = SOCK_STREAM;
#if __linux__ && !__BIONIC__
    type |= SOCK_NONBLOCK | SOCK_CLOEXEC;
#endif
    KJ_SYSCALL(socketpair(AF_UNIX, type, 0, fds));
    return CapabilityPipe { {
      lowLevel.wrapUnixSocketFd(fds[0], NEW_FD_FLAGS),
      lowLevel.wrapUnixSocketFd(fds[1], NEW_FD_FLAGS)
    } };
  }